

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

ErrCode __thiscall Regex::dumpTree(Regex *this,string *dump)

{
  ErrCode EVar1;
  Element *pEVar2;
  bool bVar3;
  Element *cur_node;
  
  EVar1 = kNotInitialized;
  if (this->mState - STATE_PREPARED < 2) {
    cur_node = &this->mRoot;
    do {
      dumpElement(this,cur_node,dump);
      pEVar2 = cur_node->mChild;
      if ((pEVar2 == (Element *)0x0) && (pEVar2 = cur_node->mNext, pEVar2 == (Element *)0x0)) {
        bVar3 = false;
        pEVar2 = cur_node;
        do {
          pEVar2 = pEVar2->mParent;
          if (pEVar2 == (Element *)0x0) {
            bVar3 = true;
            pEVar2 = (Element *)0x0;
          }
          else if (pEVar2->mNext != (Element *)0x0) {
            bVar3 = true;
            pEVar2 = pEVar2->mNext;
          }
        } while (!bVar3);
      }
      cur_node = pEVar2;
    } while (pEVar2 != (Element *)0x0);
    EVar1 = kNoError;
  }
  return EVar1;
}

Assistant:

JetHead::ErrCode	Regex::dumpTree( std::string &dump )
{
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;

	Element *cur_node = &mRoot;
	
	while( cur_node != NULL )
	{
		dumpElement( cur_node, dump );
		
		if ( cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( cur_node->mParent == NULL )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return JetHead::kNoError;
}